

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O3

gba_ppu_t * init_ppu(_Bool enable_graphics)

{
  uint *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  gba_ppu_t *pgVar11;
  long lVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  
  pgVar11 = (gba_ppu_t *)calloc(1,0x3ecd4);
  pgVar11->enable_graphics = enable_graphics;
  lVar12 = 0x12c01;
  do {
    puVar4 = (uint *)((long)(pgVar11->screen + -1) + 0x3be + lVar12 * 2);
    uVar8 = puVar4[1];
    uVar9 = puVar4[2];
    uVar10 = puVar4[3];
    puVar2 = &pgVar11->screen[0][0x77].g + lVar12 * 2;
    uVar13 = *(uint *)puVar2;
    uVar5 = *(uint *)(puVar2 + 4);
    uVar6 = *(uint *)(puVar2 + 8);
    uVar7 = *(uint *)(puVar2 + 0xc);
    puVar1 = (uint *)((long)(pgVar11->screen + -1) + 0x3be + lVar12 * 2);
    *puVar1 = *puVar4 | 0x80008000;
    puVar1[1] = uVar8 | 0x80008000;
    puVar1[2] = uVar9 | 0x80008000;
    puVar1[3] = uVar10 | 0x80008000;
    puVar2 = &pgVar11->screen[0][0x77].g + lVar12 * 2;
    *(uint *)puVar2 = uVar13 | 0x80008000;
    *(uint *)(puVar2 + 4) = uVar5 | 0x80008000;
    *(uint *)(puVar2 + 8) = uVar6 | 0x80008000;
    *(uint *)(puVar2 + 0xc) = uVar7 | 0x80008000;
    puVar2 = &pgVar11->screen[0][0xef].g + lVar12 * 2;
    uVar13 = *(uint *)(puVar2 + 4);
    uVar5 = *(uint *)(puVar2 + 8);
    uVar6 = *(uint *)(puVar2 + 0xc);
    puVar3 = &pgVar11->screen[0][0xef].g + lVar12 * 2;
    *(uint *)puVar3 = *(uint *)puVar2 | 0x80008000;
    *(uint *)(puVar3 + 4) = uVar13 | 0x80008000;
    *(uint *)(puVar3 + 8) = uVar5 | 0x80008000;
    *(uint *)(puVar3 + 0xc) = uVar6 | 0x80008000;
    puVar2 = &pgVar11->screen[1][0x77].g + lVar12 * 2;
    uVar13 = *(uint *)(puVar2 + 4);
    uVar5 = *(uint *)(puVar2 + 8);
    uVar6 = *(uint *)(puVar2 + 0xc);
    puVar3 = &pgVar11->screen[1][0x77].g + lVar12 * 2;
    *(uint *)puVar3 = *(uint *)puVar2 | 0x80008000;
    *(uint *)(puVar3 + 4) = uVar13 | 0x80008000;
    *(uint *)(puVar3 + 8) = uVar5 | 0x80008000;
    *(uint *)(puVar3 + 0xc) = uVar6 | 0x80008000;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x12cf1);
  lVar12 = 0x26162;
  do {
    *(undefined8 *)((long)(pgVar11->screen + -1) + 0x3be + lVar12) = 0;
    *(undefined8 *)(&pgVar11->screen[0][0x77].g + lVar12) = 0;
    auVar14 = pshuflw(ZEXT216(*(ushort *)pgVar11->pram),ZEXT216(*(ushort *)pgVar11->pram),0);
    uVar13 = auVar14._0_4_;
    puVar4 = (uint *)((long)pgVar11 + lVar12 * 2 + -0x26342);
    *puVar4 = uVar13 | 0x80008000;
    puVar4[1] = uVar13 | 0x80008000;
    puVar4[2] = uVar13 | 0x80008000;
    puVar4[3] = uVar13 | 0x80008000;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x26252);
  (pgVar11->BG2PB).raw = 0;
  (pgVar11->BG2PC).raw = 0;
  (pgVar11->BG2PA).raw = 0x100;
  (pgVar11->BG3PB).raw = 0;
  (pgVar11->BG3PC).raw = 0;
  (pgVar11->BG3PA).raw = 0x100;
  return pgVar11;
}

Assistant:

gba_ppu_t* init_ppu(bool enable_graphics) {
    assert(sizeof(float) == sizeof(word));

    gba_ppu_t* ppu = malloc(sizeof(gba_ppu_t));
    memset(ppu, 0, sizeof(gba_ppu_t));

    ppu->enable_graphics = enable_graphics;

    for (int x = 0; x < GBA_SCREEN_X; x++) {
        ppu->bgbuf[0][x].transparent = true;
        ppu->bgbuf[1][x].transparent = true;
        ppu->bgbuf[2][x].transparent = true;
        ppu->bgbuf[3][x].transparent = true;
    }

    clear_obj(ppu);

    ppu->BG2PA.raw = 0x0100;
    ppu->BG2PB.raw = 0x0000;
    ppu->BG2PC.raw = 0x0000;
    ppu->BG2PA.raw = 0x0100;

    ppu->BG3PA.raw = 0x0100;
    ppu->BG3PB.raw = 0x0000;
    ppu->BG3PC.raw = 0x0000;
    ppu->BG3PA.raw = 0x0100;

    return ppu;
}